

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FileDescriptorProto::ByteSizeLong(FileDescriptorProto *this)

{
  uint uVar1;
  uint uVar2;
  Rep *pRVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  void **ppvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  uVar1 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  uVar11 = (ulong)uVar1;
  uVar9 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    sVar4 = internal::WireFormatLite::StringSize
                      ((string *)
                       ((this->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[uVar9]);
    uVar11 = uVar11 + sVar4;
  }
  lVar10 = (long)(this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = uVar11 + lVar10;
  pRVar3 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar8 = 0; lVar10 * 8 != lVar8; lVar8 = lVar8 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>
                      (*(DescriptorProto **)((long)ppvVar7 + lVar8));
    lVar12 = lVar12 + sVar4;
  }
  lVar10 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + lVar10;
  pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar8 = 0; lVar10 * 8 != lVar8; lVar8 = lVar8 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>
                      (*(EnumDescriptorProto **)((long)ppvVar7 + lVar8));
    lVar12 = lVar12 + sVar4;
  }
  lVar10 = (long)(this->service_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + lVar10;
  pRVar3 = (this->service_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar8 = 0; lVar10 * 8 != lVar8; lVar8 = lVar8 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceDescriptorProto>
                      (*(ServiceDescriptorProto **)((long)ppvVar7 + lVar8));
    lVar12 = lVar12 + sVar4;
  }
  lVar10 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + lVar10;
  pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar3->elements;
  if (pRVar3 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar8 = 0; lVar10 * 8 != lVar8; lVar8 = lVar8 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      (*(FieldDescriptorProto **)((long)ppvVar7 + lVar8));
    lVar12 = lVar12 + sVar4;
  }
  sVar4 = internal::WireFormatLite::Int32Size(&this->public_dependency_);
  uVar1 = (this->public_dependency_).current_size_;
  sVar5 = internal::WireFormatLite::Int32Size(&this->weak_dependency_);
  uVar2 = (this->_has_bits_).has_bits_[0];
  sVar4 = sVar4 + lVar12 + sVar5 + (ulong)uVar1 +
          (ulong)(uint)(this->weak_dependency_).current_size_;
  if ((uVar2 & 0x1f) != 0) {
    if ((uVar2 & 1) != 0) {
      sVar5 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar2 & 2) != 0) {
      sVar5 = internal::WireFormatLite::StringSize((this->package_).ptr_);
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar2 & 4) != 0) {
      sVar5 = internal::WireFormatLite::StringSize((this->syntax_).ptr_);
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar2 & 8) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FileOptions>(this->options_);
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar2 & 0x10) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo>
                        (this->source_code_info_);
      sVar4 = sVar4 + sVar5 + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar4;
    return sVar4;
  }
  sVar4 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar4,&this->_cached_size_);
  return sVar4;
}

Assistant:

size_t FileDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string dependency = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(dependency_.size());
  for (int i = 0, n = dependency_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      dependency_.Get(i));
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1UL * this->_internal_message_type_size();
  for (const auto& msg : this->message_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1UL * this->_internal_enum_type_size();
  for (const auto& msg : this->enum_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1UL * this->_internal_service_size();
  for (const auto& msg : this->service_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1UL * this->_internal_extension_size();
  for (const auto& msg : this->extension_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated int32 public_dependency = 10;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->public_dependency_);
    total_size += 1 *
                  ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_public_dependency_size());
    total_size += data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->weak_dependency_);
    total_size += 1 *
                  ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_weak_dependency_size());
    total_size += data_size;
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string package = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_package());
    }

    // optional string syntax = 12;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_syntax());
    }

    // optional .google.protobuf.FileOptions options = 8;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *source_code_info_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}